

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_function_list.cpp
# Opt level: O3

void duckdb::FunctionList::RegisterFunctions(Catalog *catalog,CatalogTransaction transaction)

{
  get_scalar_function_t p_Var1;
  get_scalar_function_set_t p_Var2;
  get_aggregate_function_t p_Var3;
  get_aggregate_function_set_t p_Var4;
  CatalogTransaction transaction_00;
  CatalogTransaction transaction_01;
  char *pcVar5;
  InternalException *this;
  undefined1 *function;
  char *pcVar6;
  CreateScalarFunctionInfo info;
  undefined1 *local_5a0;
  char *local_598;
  undefined1 local_590 [16];
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> local_580;
  _func_int **local_568;
  char *local_560;
  char *local_558;
  vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_> *local_550;
  char *local_548;
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *local_540;
  _func_int **local_538;
  _Alloc_hider *local_530;
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> local_528;
  _func_int **local_510;
  LogicalType *local_508;
  _func_int **local_500;
  LogicalType *local_4f8;
  _func_int **local_4f0;
  _func_int **local_4e8;
  AggregateFunctionSet local_4e0;
  ScalarFunctionSet local_4a8;
  undefined1 local_470 [48];
  _Alloc_hider local_440;
  bool local_41e;
  _Alloc_hider local_348;
  char local_338 [16];
  _Alloc_hider local_328;
  char *local_320;
  char local_318 [16];
  vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_> local_308;
  _Alloc_hider local_2f0;
  char local_2e0 [16];
  vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> local_2d0;
  Catalog *local_2b8;
  DatabaseInstance *local_2b0;
  ClientContext *pCStack_2a8;
  Transaction *local_2a0;
  transaction_t tStack_298;
  transaction_t local_290;
  ScalarFunction local_288;
  AggregateFunction local_160;
  
  local_290 = transaction.start_time;
  local_2a0 = transaction.transaction.ptr;
  tStack_298 = transaction.transaction_id;
  local_2b0 = transaction.db.ptr;
  pCStack_2a8 = transaction.context.ptr;
  local_4f8 = &local_288.super_BaseScalarFunction.return_type;
  local_508 = &local_160.super_BaseScalarFunction.return_type;
  local_500 = (_func_int **)&PTR__CreateAggregateFunctionInfo_01981160;
  local_538 = (_func_int **)&PTR__CreateFunctionInfo_01966ba0;
  local_510 = (_func_int **)&PTR__AggregateFunction_01966bf8;
  local_568 = (_func_int **)&PTR__BaseScalarFunction_01963d30;
  local_4e8 = (_func_int **)&PTR__CreateScalarFunctionInfo_01981320;
  local_4f0 = (_func_int **)&PTR__ScalarFunction_01963628;
  local_530 = &local_328;
  local_540 = &local_2d0;
  local_548 = local_2e0;
  local_550 = &local_308;
  local_558 = local_318;
  local_560 = local_338;
  pcVar6 = "!~~";
  function = duckdb::function;
  local_2b8 = catalog;
  do {
    p_Var1 = ((StaticFunctionDefinition *)function)->get_function;
    if (p_Var1 == (get_scalar_function_t)0x0) {
      p_Var2 = ((StaticFunctionDefinition *)function)->get_function_set;
      if (p_Var2 != (get_scalar_function_set_t)0x0) {
        ScalarFunctionSet::ScalarFunctionSet((ScalarFunctionSet *)&local_5a0);
        (*p_Var2)((ScalarFunctionSet *)local_470);
        ::std::__cxx11::string::operator=((string *)&local_5a0,(string *)local_470);
        local_528.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_580.
             super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_528.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_580.
             super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_528.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_580.
             super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_580.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_440._M_p;
        local_580.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_470._32_8_;
        local_580.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_470._40_8_;
        local_470._32_8_ = 0;
        local_470._40_8_ = 0;
        local_440._M_p = (pointer)0x0;
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                  ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                   &local_528);
        ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                  ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                   (local_470 + 0x20));
        if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
          operator_delete((void *)local_470._0_8_);
        }
        goto LAB_002482d5;
      }
      p_Var3 = ((StaticFunctionDefinition *)function)->get_aggregate_function;
      if (p_Var3 == (get_aggregate_function_t)0x0) {
        p_Var4 = ((StaticFunctionDefinition *)function)->get_aggregate_function_set;
        if (p_Var4 == (get_aggregate_function_set_t)0x0) {
          this = (InternalException *)__cxa_allocate_exception(0x10);
          local_470._0_8_ = local_470 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_470,"Do not know how to register function of this type","");
          InternalException::InternalException(this,(string *)local_470);
          __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        AggregateFunctionSet::AggregateFunctionSet((AggregateFunctionSet *)&local_5a0);
        (*p_Var4)((AggregateFunctionSet *)local_470);
        ::std::__cxx11::string::operator=((string *)&local_5a0,(string *)local_470);
        local_528.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_580.
             super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_528.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_580.
             super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_528.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_start =
             local_580.
             super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_580.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_440._M_p;
        local_580.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)local_470._32_8_;
        local_580.
        super__Vector_base<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)local_470._40_8_;
        local_470._32_8_ = 0;
        local_470._40_8_ = 0;
        local_440._M_p = (pointer)0x0;
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        ~vector(&local_528);
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        ~vector((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
                (local_470 + 0x20));
        if ((undefined1 *)local_470._0_8_ != local_470 + 0x10) {
          operator_delete((void *)local_470._0_8_);
        }
      }
      else {
        AggregateFunctionSet::AggregateFunctionSet((AggregateFunctionSet *)&local_5a0);
        (*p_Var3)(&local_160);
        ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
        emplace_back<duckdb::AggregateFunction>(&local_580,&local_160);
        local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_510;
        if (local_160.function_info.internal.
            super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_160.function_info.internal.
                     super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        local_160.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
             local_568;
        LogicalType::~LogicalType(local_508);
        SimpleFunction::~SimpleFunction((SimpleFunction *)&local_160);
      }
      pcVar5 = local_598;
      strlen(pcVar6);
      ::std::__cxx11::string::_M_replace((ulong)&local_5a0,0,pcVar5,(ulong)pcVar6);
      local_4e0.super_FunctionSet<duckdb::AggregateFunction>.name._M_dataplus._M_p =
           (pointer)&local_4e0.super_FunctionSet<duckdb::AggregateFunction>.name.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4e0,local_5a0,local_598 + (long)local_5a0);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::vector
                (&local_4e0.super_FunctionSet<duckdb::AggregateFunction>.functions.
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                 ,&local_580);
      CreateAggregateFunctionInfo::CreateAggregateFunctionInfo
                ((CreateAggregateFunctionInfo *)local_470,&local_4e0);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::~vector
                (&local_4e0.super_FunctionSet<duckdb::AggregateFunction>.functions.
                  super_vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>
                );
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0.super_FunctionSet<duckdb::AggregateFunction>.name._M_dataplus._M_p !=
          &local_4e0.super_FunctionSet<duckdb::AggregateFunction>.name.field_2) {
        operator_delete(local_4e0.super_FunctionSet<duckdb::AggregateFunction>.name._M_dataplus._M_p
                       );
      }
      pcVar5 = local_320;
      local_41e = true;
      pcVar6 = ((StaticFunctionDefinition *)function)->alias_of;
      strlen(pcVar6);
      ::std::__cxx11::string::_M_replace((ulong)local_530,0,pcVar5,(ulong)pcVar6);
      FillFunctionDescriptions<duckdb::StaticFunctionDefinition,duckdb::CreateAggregateFunctionInfo>
                ((StaticFunctionDefinition *)function,(CreateAggregateFunctionInfo *)local_470);
      transaction_01.context.ptr = pCStack_2a8;
      transaction_01.db.ptr = local_2b0;
      transaction_01.transaction.ptr = local_2a0;
      transaction_01.transaction_id = tStack_298;
      transaction_01.start_time = local_290;
      Catalog::CreateFunction(local_2b8,transaction_01,(CreateFunctionInfo *)local_470);
      local_470._0_8_ = local_500;
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::~vector
                (local_540);
      if (local_2f0._M_p != local_548) {
        operator_delete(local_2f0._M_p);
      }
      local_470._0_8_ = local_538;
      ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::
      ~vector(local_550);
      if (local_328._M_p != local_558) {
        operator_delete(local_328._M_p);
      }
      if (local_348._M_p != local_560) {
        operator_delete(local_348._M_p);
      }
      CreateInfo::~CreateInfo((CreateInfo *)local_470);
      ::std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::~vector
                (&local_580);
    }
    else {
      ScalarFunctionSet::ScalarFunctionSet((ScalarFunctionSet *)&local_5a0);
      (*p_Var1)(&local_288);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 &local_580,&local_288);
      local_288.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           local_4f0;
      if (local_288.function_info.internal.
          super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.function_info.internal.
                   super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_288.function.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_288.function.super__Function_base._M_manager)
                  ((_Any_data *)&local_288.function,(_Any_data *)&local_288.function,
                   __destroy_functor);
      }
      local_288.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
           local_568;
      LogicalType::~LogicalType(local_4f8);
      SimpleFunction::~SimpleFunction((SimpleFunction *)&local_288);
LAB_002482d5:
      pcVar5 = local_598;
      strlen(pcVar6);
      ::std::__cxx11::string::_M_replace((ulong)&local_5a0,0,pcVar5,(ulong)pcVar6);
      local_4a8.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p =
           (pointer)&local_4a8.super_FunctionSet<duckdb::ScalarFunction>.name.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4a8,local_5a0,local_598 + (long)local_5a0);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::vector
                (&local_4a8.super_FunctionSet<duckdb::ScalarFunction>.functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 &local_580);
      CreateScalarFunctionInfo::CreateScalarFunctionInfo
                ((CreateScalarFunctionInfo *)local_470,&local_4a8);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                (&local_4a8.super_FunctionSet<duckdb::ScalarFunction>.functions.
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p !=
          &local_4a8.super_FunctionSet<duckdb::ScalarFunction>.name.field_2) {
        operator_delete(local_4a8.super_FunctionSet<duckdb::ScalarFunction>.name._M_dataplus._M_p);
      }
      pcVar5 = local_320;
      local_41e = true;
      pcVar6 = ((StaticFunctionDefinition *)function)->alias_of;
      strlen(pcVar6);
      ::std::__cxx11::string::_M_replace((ulong)local_530,0,pcVar5,(ulong)pcVar6);
      FillFunctionDescriptions<duckdb::StaticFunctionDefinition,duckdb::CreateScalarFunctionInfo>
                ((StaticFunctionDefinition *)function,(CreateScalarFunctionInfo *)local_470);
      transaction_00.context.ptr = pCStack_2a8;
      transaction_00.db.ptr = local_2b0;
      transaction_00.transaction.ptr = local_2a0;
      transaction_00.transaction_id = tStack_298;
      transaction_00.start_time = local_290;
      Catalog::CreateFunction(local_2b8,transaction_00,(CreateFunctionInfo *)local_470);
      local_470._0_8_ = local_4e8;
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 local_540);
      if (local_2f0._M_p != local_548) {
        operator_delete(local_2f0._M_p);
      }
      local_470._0_8_ = local_538;
      ::std::vector<duckdb::FunctionDescription,_std::allocator<duckdb::FunctionDescription>_>::
      ~vector(local_550);
      if (local_328._M_p != local_558) {
        operator_delete(local_328._M_p);
      }
      if (local_348._M_p != local_560) {
        operator_delete(local_348._M_p);
      }
      CreateInfo::~CreateInfo((CreateInfo *)local_470);
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::~vector
                ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                 &local_580);
    }
    if (local_5a0 != local_590) {
      operator_delete(local_5a0);
    }
    pcVar6 = ((StaticFunctionDefinition *)((long)function + 0x50))->name;
    function = (undefined1 *)((long)function + 0x50);
    if (pcVar6 == (char *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

MainRegisterContext(Catalog &catalog, CatalogTransaction transaction) : catalog(catalog), transaction(transaction) {
	}